

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O2

void sg_init_buffer(sg_buffer buf_id,sg_buffer_desc *desc)

{
  undefined4 uVar1;
  long lVar2;
  sg_buffer_desc *psVar3;
  sg_usage sVar4;
  sg_buffer_desc def;
  
  if (_sg.valid) {
    psVar3 = &def;
    for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
      uVar1 = *(undefined4 *)&desc->field_0x4;
      psVar3->_start_canary = desc->_start_canary;
      *(undefined4 *)&psVar3->field_0x4 = uVar1;
      desc = (sg_buffer_desc *)&desc->size;
      psVar3 = (sg_buffer_desc *)&psVar3->size;
    }
    sVar4 = def.usage;
    def.type = def.type + (uint)(def.type == _SG_BUFFERTYPE_DEFAULT);
    def.usage = sVar4 + (sVar4 == _SG_USAGE_DEFAULT);
    if (def.size == 0) {
      def.size = def.data.size;
    }
    else if (def.data.size == 0) {
      def.data.size = def.size;
    }
    _sg_init_buffer(buf_id,&def);
    return;
  }
  __assert_fail("_sg.valid",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                ,0x3a49,"void sg_init_buffer(sg_buffer, const sg_buffer_desc *)");
}

Assistant:

inline void sg_init_buffer(sg_buffer buf_id, const sg_buffer_desc& desc) { return sg_init_buffer(buf_id, &desc); }